

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O1

void __thiscall asl::XdlParser::end_object(XdlParser *this)

{
  Var *pVVar1;
  EVP_PKEY_CTX *in_RDX;
  Var v;
  Var local_28;
  
  pVVar1 = (this->_lists).super_Array<asl::Var>._a;
  local_28._0_8_ = *(undefined8 *)(pVVar1 + (long)(int)pVVar1[-1]._type + -1);
  local_28.field_1 = pVVar1[(long)(int)pVVar1[-1]._type + -1].field_1;
  if ((local_28._0_8_ & 8) != 0) {
    Var::copy(&local_28,(EVP_PKEY_CTX *)(pVVar1 + (long)(int)pVVar1[-1]._type + -1),in_RDX);
  }
  Array<asl::Var>::resize
            (&(this->_lists).super_Array<asl::Var>,
             (this->_lists).super_Array<asl::Var>._a[-1]._type - NUL);
  put(this,&local_28);
  Var::~Var(&local_28);
  return;
}

Assistant:

void XdlParser::end_object()
{
	Var v = _lists.top();
	_lists.pop();
	put(v);
}